

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O0

Generator * kratos::create_wrapper_flatten(Generator *top,string *wrapper_name)

{
  pointer *this;
  string *psVar1;
  undefined8 uVar2;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  uint64_t uVar4;
  undefined1 auVar5 [8];
  bool bVar6;
  PortDirection PVar7;
  int iVar8;
  Context *this_00;
  Generator *this_01;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>_>
  *pmVar9;
  Param *pPVar10;
  element_type *peVar11;
  int64_t iVar12;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_02;
  element_type *peVar13;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar14;
  size_type sVar15;
  reference pvVar16;
  element_type *var;
  const_reference pvVar17;
  undefined4 extraout_var;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var18;
  InternalException *this_03;
  uint32_t *puVar19;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar20;
  format_args args;
  string_view format_str;
  enable_shared_from_this<kratos::Var> local_300;
  undefined1 local_2f0 [32];
  undefined1 local_2d0 [40];
  Port *new_port_1;
  string local_2a0;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_280;
  uint64_t i;
  VarSlice *slice_port;
  remove_reference_t<std::__cxx11::basic_string<char>_&> *local_250;
  uint *s;
  const_iterator __end4;
  const_iterator __begin4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range4;
  string name_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *slice;
  iterator __end3;
  iterator __begin3;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *__range3;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  slices;
  undefined1 local_1c8 [32];
  undefined1 local_1a8 [40];
  Port *new_port;
  shared_ptr<kratos::Port> p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *port_name;
  iterator __end1_1;
  iterator __begin1_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ports;
  undefined8 local_138;
  Param *new_p;
  type *param;
  type *name;
  _Self local_118;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>_>
  *__range1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>_>
  params;
  enable_shared_from_this<kratos::Generator> local_c0;
  undefined1 local_b0 [8];
  Generator *gen;
  string *wrapper_name_local;
  Generator *top_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_90;
  basic_string_view<char> local_88;
  _Rb_tree_node_base local_78;
  _Rb_tree_node_base *local_58;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_unsigned_int>
  *vargs;
  pointer local_48;
  __node_base local_40;
  _Base_ptr local_38;
  _Rb_tree_node_base *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  _Rb_tree_node_base *local_20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_18;
  
  gen = (Generator *)wrapper_name;
  wrapper_name_local = (string *)top;
  this_00 = Generator::context(top);
  this_01 = Context::generator(this_00,(string *)gen);
  psVar1 = wrapper_name_local + 4;
  local_b0 = (undefined1  [8])this_01;
  std::enable_shared_from_this<kratos::Generator>::shared_from_this(&local_c0);
  Generator::add_child_generator
            (this_01,(string *)((long)&psVar1->field_2 + 8),
             (shared_ptr<kratos::Generator> *)&local_c0);
  std::shared_ptr<kratos::Generator>::~shared_ptr((shared_ptr<kratos::Generator> *)&local_c0);
  pmVar9 = Generator::get_params_abi_cxx11_((Generator *)wrapper_name_local);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>_>
         *)&__range1,pmVar9);
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>_>
           ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>_>
                    *)&__range1);
  local_118._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>_>
              *)&__range1);
  while( true ) {
    bVar6 = std::operator!=(&__end1,&local_118);
    if (!bVar6) break;
    name = &std::
            _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>
            ::operator*(&__end1)->first;
    param = (type *)std::get<0ul,std::__cxx11::string_const,std::shared_ptr<kratos::Param>>
                              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>
                                *)name);
    new_p = (Param *)std::get<1ul,std::__cxx11::string_const,std::shared_ptr<kratos::Param>>
                               ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>
                                 *)name);
    pPVar10 = Generator::parameter((Generator *)local_b0,(string *)param,0x20);
    local_138 = pPVar10;
    peVar11 = std::__shared_ptr_access<kratos::Param,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<kratos::Param,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)new_p);
    iVar12 = Const::value(&peVar11->super_Const);
    (*(pPVar10->super_Const).super_Var.super_IRNode._vptr_IRNode[0x2b])(pPVar10,iVar12);
    peVar11 = std::__shared_ptr_access<kratos::Param,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<kratos::Param,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)new_p);
    Var::as<kratos::Param>((Var *)&ports);
    Param::set_value(peVar11,(shared_ptr<kratos::Param> *)&ports);
    std::shared_ptr<kratos::Param>::~shared_ptr((shared_ptr<kratos::Param> *)&ports);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>
    ::operator++(&__end1);
  }
  this_02 = Generator::get_port_names_abi_cxx11_((Generator *)wrapper_name_local);
  __end1_1 = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(this_02);
  port_name = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(this_02);
  do {
    bVar6 = std::operator!=(&__end1_1,(_Self *)&port_name);
    auVar5 = local_b0;
    if (!bVar6) {
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>_>
              *)&__range1);
      return (Generator *)auVar5;
    }
    p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::
         _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::operator*(&__end1_1);
    Generator::get_port((Generator *)&new_port,wrapper_name_local);
    peVar13 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&new_port);
    pvVar14 = Var::size(&peVar13->super_Var);
    sVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar14);
    if (sVar15 == 1) {
      peVar13 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&new_port);
      pvVar14 = Var::size(&peVar13->super_Var);
      pvVar16 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar14,0);
      auVar5 = local_b0;
      if (*pvVar16 != 1) goto LAB_0026b23b;
      peVar13 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator*((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&new_port);
      local_1a8._32_8_ = Generator::port((Generator *)auVar5,peVar13,true);
      peVar13 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&new_port);
      PVar7 = Port::port_direction(peVar13);
      auVar5 = local_b0;
      uVar2 = local_1a8._32_8_;
      if (PVar7 == In) {
        peVar13 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&new_port);
        Var::assign((Var *)local_1a8,&peVar13->super_Var,(AssignmentType)local_1a8._32_8_);
        std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
                  ((shared_ptr<kratos::Stmt> *)(local_1a8 + 0x10),
                   (shared_ptr<kratos::AssignStmt> *)local_1a8);
        Generator::add_stmt((Generator *)auVar5,(shared_ptr<kratos::Stmt> *)(local_1a8 + 0x10));
        std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_1a8 + 0x10));
        std::shared_ptr<kratos::AssignStmt>::~shared_ptr
                  ((shared_ptr<kratos::AssignStmt> *)local_1a8);
      }
      else {
        this = &slices.
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::shared_ptr<kratos::Var>::shared_ptr<kratos::Port,void>
                  ((shared_ptr<kratos::Var> *)this,(shared_ptr<kratos::Port> *)&new_port);
        Var::assign((Var *)local_1c8,(shared_ptr<kratos::Var> *)uVar2,(AssignmentType)this);
        std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
                  ((shared_ptr<kratos::Stmt> *)(local_1c8 + 0x10),
                   (shared_ptr<kratos::AssignStmt> *)local_1c8);
        Generator::add_stmt((Generator *)auVar5,(shared_ptr<kratos::Stmt> *)(local_1c8 + 0x10));
        std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_1c8 + 0x10));
        std::shared_ptr<kratos::AssignStmt>::~shared_ptr
                  ((shared_ptr<kratos::AssignStmt> *)local_1c8);
        std::shared_ptr<kratos::Var>::~shared_ptr
                  ((shared_ptr<kratos::Var> *)
                   &slices.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      peVar13 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator*((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&new_port);
      copy_attrs(&peVar13->super_Var,(Var *)local_1a8._32_8_);
    }
    else {
LAB_0026b23b:
      var = std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get
                      ((__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)&new_port);
      get_flatten_slices((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          *)&__range3,&var->super_Var);
      __end3 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::begin((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        *)&__range3);
      slice = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
              std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::end((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     *)&__range3);
      while( true ) {
        bVar6 = __gnu_cxx::operator!=
                          (&__end3,(__normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                                    *)&slice);
        if (!bVar6) break;
        name_1.field_2._8_8_ =
             __gnu_cxx::
             __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
             ::operator*(&__end3);
        std::__cxx11::string::string
                  ((string *)&__range4,
                   (string *)
                   p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ;
        uVar2 = name_1.field_2._8_8_;
        __end4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            name_1.field_2._8_8_);
        s = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)uVar2);
        while( true ) {
          bVar6 = __gnu_cxx::operator!=
                            (&__end4,(__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                      *)&s);
          if (!bVar6) break;
          local_250 = (remove_reference_t<std::__cxx11::basic_string<char>_&> *)
                      __gnu_cxx::
                      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      ::operator*(&__end4);
          local_38 = (_Base_ptr)&slice_port;
          local_40._M_nxt = (_Hash_node_base *)0x4304a3;
          local_48 = (pointer)&__range4;
          vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_unsigned_int>
                   *)local_250;
          fmt::v7::make_args_checked<std::__cxx11::string&,unsigned_int_const&,char[8],char>
                    ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_unsigned_int>
                      *)&local_78,(v7 *)"{0}_{1}",(char (*) [8])local_48,local_250,
                     (remove_reference_t<const_unsigned_int_&> *)in_R8.values_);
          local_58 = &local_78;
          bVar20 = fmt::v7::to_string_view<char,_0>((char *)local_40._M_nxt);
          local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                      *)&top_local;
          local_30 = local_58;
          local_20 = local_58;
          local_18._8_8_ = local_58;
          local_18._M_allocated_capacity = (size_type)local_28;
          local_88 = bVar20;
          fmt::v7::
          basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          ::basic_format_args(local_28,0x2d,
                              (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                               *)local_58);
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.values_ = in_R9.values_;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)local_90.values_;
          format_str.size_ = (size_t)top_local;
          format_str.data_ = (char *)local_88.size_;
          in_R8 = local_90;
          fmt::v7::detail::vformat_abi_cxx11_
                    ((string *)&slice_port,(detail *)local_88.data_,format_str,args);
          std::__cxx11::string::operator=((string *)&__range4,(string *)&slice_port);
          std::__cxx11::string::~string((string *)&slice_port);
          __gnu_cxx::
          __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
          ::operator++(&__end4);
        }
        peVar13 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator*((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&new_port);
        pvVar17 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                             name_1.field_2._8_8_,0);
        iVar8 = (*(peVar13->super_Var).super_IRNode._vptr_IRNode[9])(peVar13,(ulong)*pvVar17);
        i = CONCAT44(extraout_var,iVar8);
        local_280._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
        while( true ) {
          _Var3._M_pi = local_280._M_pi;
          p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               name_1.field_2._8_8_);
          uVar4 = i;
          if (p_Var18 <= _Var3._M_pi) break;
          pvVar17 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               name_1.field_2._8_8_,(size_type)local_280._M_pi);
          i = (**(code **)(*(long *)uVar4 + 0x48))(uVar4,*pvVar17);
          local_280._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&((__shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2> *)
                       &(local_280._M_pi)->_vptr__Sp_counted_base)->_M_ptr + 1);
        }
        pvVar14 = Var::size((Var *)i);
        sVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar14);
        if (sVar15 != 1) {
LAB_0026b5a4:
          new_port_1._6_1_ = 1;
          this_03 = (InternalException *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2a0,"Unable to slice ports when flattening",
                     (allocator<char> *)((long)&new_port_1 + 7));
          InternalException::InternalException(this_03,&local_2a0);
          new_port_1._6_1_ = 0;
          __cxa_throw(this_03,&InternalException::typeinfo,InternalException::~InternalException);
        }
        pvVar14 = Var::size((Var *)i);
        pvVar16 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar14,0);
        auVar5 = local_b0;
        if (*pvVar16 != 1) goto LAB_0026b5a4;
        peVar13 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&new_port);
        PVar7 = Port::port_direction(peVar13);
        puVar19 = Var::var_width((Var *)i);
        local_2d0._32_8_ = Generator::port((Generator *)auVar5,PVar7,(string *)&__range4,*puVar19);
        peVar13 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&new_port);
        PVar7 = Port::port_direction(peVar13);
        auVar5 = local_b0;
        uVar2 = local_2d0._32_8_;
        if (PVar7 == In) {
          Var::assign((Var *)local_2d0,(Var *)i,(AssignmentType)local_2d0._32_8_);
          std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
                    ((shared_ptr<kratos::Stmt> *)(local_2d0 + 0x10),
                     (shared_ptr<kratos::AssignStmt> *)local_2d0);
          Generator::add_stmt((Generator *)auVar5,(shared_ptr<kratos::Stmt> *)(local_2d0 + 0x10));
          std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_2d0 + 0x10))
          ;
          std::shared_ptr<kratos::AssignStmt>::~shared_ptr
                    ((shared_ptr<kratos::AssignStmt> *)local_2d0);
        }
        else {
          std::enable_shared_from_this<kratos::Var>::shared_from_this(&local_300);
          Var::assign((Var *)local_2f0,(shared_ptr<kratos::Var> *)uVar2,(AssignmentType)&local_300);
          std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
                    ((shared_ptr<kratos::Stmt> *)(local_2f0 + 0x10),
                     (shared_ptr<kratos::AssignStmt> *)local_2f0);
          Generator::add_stmt((Generator *)auVar5,(shared_ptr<kratos::Stmt> *)(local_2f0 + 0x10));
          std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_2f0 + 0x10))
          ;
          std::shared_ptr<kratos::AssignStmt>::~shared_ptr
                    ((shared_ptr<kratos::AssignStmt> *)local_2f0);
          std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)&local_300);
        }
        peVar13 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator*((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&new_port);
        copy_attrs(&peVar13->super_Var,(Var *)local_2d0._32_8_);
        std::__cxx11::string::~string((string *)&__range4);
        __gnu_cxx::
        __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
        ::operator++(&__end3);
      }
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *)&__range3);
    }
    std::shared_ptr<kratos::Port>::~shared_ptr((shared_ptr<kratos::Port> *)&new_port);
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1_1);
  } while( true );
}

Assistant:

Generator& create_wrapper_flatten(Generator* top, const std::string& wrapper_name) {
    auto& gen = top->context()->generator(wrapper_name);
    gen.add_child_generator(top->instance_name, top->shared_from_this());
    // copy the parameter definition over
    auto params = top->get_params();
    for (auto const& [name, param] : params) {
        auto& new_p = gen.parameter(name, 32);
        new_p.set_value(param->value());
        param->set_value(new_p.as<Param>());
    }

    auto const& ports = top->get_port_names();
    for (auto const& port_name : ports) {
        auto p = top->get_port(port_name);
        if (p->size().size() == 1 && p->size()[0] == 1) {
            // this is a normal wire
            auto& new_port = gen.port(*p);
            if (p->port_direction() == PortDirection::In) {
                gen.add_stmt(p->assign(new_port, AssignmentType::Blocking));
            } else {
                gen.add_stmt(new_port.assign(p, AssignmentType::Blocking));
            }
            copy_attrs(*p, new_port);
        } else {
            // need to flatten the array
            auto slices = get_flatten_slices(p.get());
            // create port for them based on the slice
            for (auto const& slice : slices) {
                std::string name = port_name;
                for (auto const& s : slice) name = ::format("{0}_{1}", name, s);
                auto* slice_port = &(*p)[slice[0]];
                for (uint64_t i = 1; i < slice.size(); i++) slice_port = &(*slice_port)[slice[i]];
                if (slice_port->size().size() != 1 || slice_port->size()[0] != 1)
                    throw InternalException("Unable to slice ports when flattening");
                auto& new_port = gen.port(p->port_direction(), name, slice_port->var_width());
                if (p->port_direction() == PortDirection::In) {
                    gen.add_stmt(slice_port->assign(new_port, AssignmentType::Blocking));
                } else {
                    gen.add_stmt(
                        new_port.assign(slice_port->shared_from_this(), AssignmentType::Blocking));
                }
                copy_attrs(*p, new_port);
            }
        }
    }
    return gen;
}